

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

void __thiscall Ptex::v2_4::StringKey::StringKey(StringKey *this,char *val)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  uint64_t val64 [4];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  long local_48 [4];
  
  this->_val = val;
  sVar7 = strlen(val);
  this->_len = (uint32_t)sVar7;
  pcVar2 = this->_val;
  uVar1 = this->_len;
  local_48[0] = 0;
  memcpy(local_48,pcVar2 + ((long)(int)uVar1 & 0xfffffffffffffff8U),(ulong)(uVar1 & 7));
  local_58 = (undefined1  [16])0x0;
  auVar6 = local_58;
  local_58._0_12_ = SUB1612((undefined1  [16])0x0,0);
  local_68._8_8_ = 0;
  local_68._0_8_ = local_48[0] * 0x1000193;
  auVar5 = local_68;
  local_68._8_4_ = 0;
  if (0x1f < (int)((long)(int)uVar1 & 0xfffffffffffffff8U)) {
    uVar8 = 0;
    pcVar9 = pcVar2;
    local_68 = auVar5;
    local_58 = auVar6;
    do {
      local_48[0] = *(long *)(pcVar2 + uVar8 * 0x20);
      lVar10 = 0;
      do {
        uVar3 = *(ulong *)((long)(pcVar9 + lVar10 * 8) + 8);
        uVar4 = *(ulong *)(local_68 + lVar10 * 8 + 8);
        *(ulong *)(local_68 + lVar10 * 8) =
             ((*(ulong *)(local_68 + lVar10 * 8) >> 0x20) * 0x1000193 << 0x20) +
             (*(ulong *)(local_68 + lVar10 * 8) & 0xffffffff) * 0x1000193 ^
             *(ulong *)(pcVar9 + lVar10 * 8);
        *(ulong *)(local_68 + lVar10 * 8 + 8) =
             ((uVar4 >> 0x20) * 0x1000193 << 0x20) + (uVar4 & 0xffffffff) * 0x1000193 ^ uVar3;
        lVar10 = lVar10 + 2;
      } while (lVar10 != 4);
      uVar8 = uVar8 + 1;
      pcVar9 = pcVar9 + 0x20;
    } while (uVar8 != (uVar1 - 0x20 >> 5) + 1);
  }
  this->_hash = (local_68._0_4_ * 0x1000193 ^ local_68._8_4_) * 0x1000193 ^
                local_58._0_4_ * 0x1000193 ^ local_58._8_4_;
  this->_ownsVal = false;
  return;
}

Assistant:

StringKey(const char* val)
    {
        _val = val;
        _len = uint32_t(strlen(val));
        _hash = memHash(_val, _len);
        _ownsVal = false;
    }